

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

int Gia_Sim2ClassRefineOne(Gia_Sim2_t *p,int i)

{
  Vec_Int_t *p_00;
  uint *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *p_01;
  long lVar7;
  long lVar8;
  
  iVar6 = 0;
  while( true ) {
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_IntPush(p_00,i);
    pGVar4 = Gia_ManObj(p->pAig,i);
    lVar8 = (long)i;
    lVar7 = p->nWords * lVar8;
    puVar1 = p->pDataSim;
    p_01 = p->pAig;
    iVar2 = Gia_ObjIsHead(p_01,i);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim2.c"
                    ,0x19b,"int Gia_Sim2ClassRefineOne(Gia_Sim2_t *, int)");
    }
    while( true ) {
      iVar2 = p_01->pNexts[lVar8];
      lVar8 = (long)iVar2;
      if (lVar8 < 1) break;
      pGVar5 = Gia_ManObj(p_01,iVar2);
      iVar3 = Gia_Sim2CompareEqual
                        (puVar1 + lVar7,p->pDataSim + p->nWords * iVar2,p->nWords,
                         ((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) ^
                         (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20)) >> 0x1f);
      Vec_IntPush((&p->vClassOld)[iVar3 == 0],iVar2);
      p_01 = p->pAig;
    }
    if (p->vClassNew->nSize == 0) break;
    Gia_Sim2ClassCreate(p_01,p->vClassOld);
    Gia_Sim2ClassCreate(p->pAig,p->vClassNew);
    if (p->vClassNew->nSize < 2) {
      iVar2 = 1;
      goto LAB_002037ef;
    }
    i = Vec_IntEntry(p->vClassNew,0);
    iVar6 = iVar6 + 1;
  }
  iVar2 = 0;
LAB_002037ef:
  return iVar2 + iVar6;
}

Assistant:

int Gia_Sim2ClassRefineOne( Gia_Sim2_t * p, int i )
{
    Gia_Obj_t * pObj0, * pObj1;
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj0 = Gia_ManObj( p->pAig, i );
    pSim0 = Gia_Sim2Data( p, i );
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pObj1 = Gia_ManObj( p->pAig, Ent );
        pSim1 = Gia_Sim2Data( p, Ent );
        if ( Gia_Sim2CompareEqual( pSim0, pSim1, p->nWords, Gia_ObjPhase(pObj0) ^ Gia_ObjPhase(pObj1) ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Gia_Sim2ClassCreate( p->pAig, p->vClassOld );
    Gia_Sim2ClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Gia_Sim2ClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}